

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O0

void __thiscall QGestureEvent::~QGestureEvent(QGestureEvent *this)

{
  QEvent *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__QGestureEvent_00d06ec0;
  QMap<Qt::GestureType,_QWidget_*>::~QMap((QMap<Qt::GestureType,_QWidget_*> *)0x2fc3ce);
  QMap<Qt::GestureType,_bool>::~QMap((QMap<Qt::GestureType,_bool> *)0x2fc3dc);
  QList<QGesture_*>::~QList((QList<QGesture_*> *)0x2fc3ea);
  QEvent::~QEvent(in_RDI);
  return;
}

Assistant:

QGestureEvent::~QGestureEvent()
{
}